

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O1

string * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG>::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,
          BGIP_SolverCreator_AM<JointPolicyPureVectorForClusteredBG> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"BGIP_SolverCreator_AM object with ",0x22);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,", _m_verbose=",0xd);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,this->_m_verbose);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", _m_nrSolutions=",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", _m_nrRestarts=",0x10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string SoftPrint() const
        {
            std::stringstream ss;
            ss << "BGIP_SolverCreator_AM object with "<<
                ", _m_verbose="<<_m_verbose <<
                ", _m_nrSolutions="<<_m_nrSolutions<<
                ", _m_nrRestarts="<<_m_nrRestarts;
            return (ss.str());
        }